

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O2

ssize_t send_parts(int fd,msghdr *msg,int flags)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong __n;
  
  uVar1 = (ulong)bytes_to_send * 9;
  uVar2 = 0;
  uVar4 = 0;
  uVar3 = uVar1;
  while( true ) {
    uVar5 = (ulong)uVar4;
    if (msg->msg_iovlen <= uVar5) {
      return uVar1;
    }
    __n = msg->msg_iov[uVar5].iov_len;
    if (uVar3 < __n) {
      __n = uVar3;
    }
    memcpy(send_buffer + uVar2,msg->msg_iov[uVar5].iov_base,__n);
    uVar3 = uVar3 - __n;
    if (uVar3 == 0) break;
    uVar2 = uVar2 + (int)__n;
    uVar4 = uVar4 + 1;
  }
  return uVar1;
}

Assistant:

static ssize_t send_parts(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	unsigned int len = 0;
	size_t remaining_bytes = bytes_to_send;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		size_t minimum = CIO_MIN(remaining_bytes, msg->msg_iov[i].iov_len);
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, minimum);
		len += (unsigned int)minimum;
		remaining_bytes -= minimum;
		if (remaining_bytes == 0) {
			return (ssize_t)bytes_to_send;
		}
	}

	return (ssize_t)bytes_to_send;
}